

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jediorder_wang_test.cc
# Opt level: O2

int main(int param_1,char **argv)

{
  istream *piVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
  trees_collection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> results;
  CostModel ucm;
  size_t single_value;
  string results_file_name;
  string input_file_name;
  WANG wang_algorithm;
  LabelDictionary ld;
  TreeIndexer ti1;
  BracketNotationParser<label::JSONLabel> bnp;
  ifstream results_file;
  TreeIndexer ti2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input_file_name,argv[1],(allocator<char> *)&results_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&results_file_name,argv[2],(allocator<char> *)&results_file);
  ld.label_to_id_dictionary_._M_h._M_buckets = &ld.label_to_id_dictionary_._M_h._M_single_bucket;
  ld.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  ld.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ld.label_to_id_dictionary_._M_h._M_element_count = 0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ld.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  ld.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ld.id_to_label_dictionary_.super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ld.id_to_label_dictionary_.super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  ld.id_to_label_dictionary_.super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  ld.id_to_label_dictionary_.super__Vector_base<label::JSONLabel,_std::allocator<label::JSONLabel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  ld._76_8_ = 0;
  wang_algorithm.
  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>.c_ =
       &ucm;
  wang_algorithm.
  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>.
  _vptr_JEDIAlgorithm = (_func_int **)&PTR_jedi_0010cd60;
  ucm.ld_ = &ld;
  wang_algorithm.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.df_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.e0_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.e_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.del_forest_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.del_tree_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.ins_f2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.ins_t2_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wang_algorithm.del_f1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wang_algorithm.del_t1_subtree_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wang_algorithm.e_init_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&results_file,(string *)&results_file_name,_S_in);
  single_value = 0;
  ti1.super_Constants._0_8_ = &ti1.super_ListKR;
  ti1.super_Constants.tree_height_ = 0;
  ti1._12_4_ = 0;
  ti1.super_ListKR.list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&results_file,(string *)&ti1);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    __isoc99_sscanf(ti1.super_Constants._0_8_,"%zu",&single_value);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&results,&single_value);
  }
  std::__cxx11::string::~string((string *)&ti1);
  memset(&ti1.super_ListKR,0,0x180);
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count = 1;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin._M_nxt
       = (_Hash_node_base *)0x0;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count = 0;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       &ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket;
  memset(&ti2.super_ListKR,0,0x180);
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count = 1;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin._M_nxt
       = (_Hash_node_base *)0x0;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count = 0;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  trees_collection.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trees_collection.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trees_collection.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket;
  parser::BracketNotationParser<label::JSONLabel>::BracketNotationParser(&bnp);
  parser::BracketNotationParser<label::JSONLabel>::parse_collection
            (&bnp,&trees_collection,&input_file_name);
  iVar3 = 2;
  do {
    if ((ulong)((long)trees_collection.
                      super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)trees_collection.
                      super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= (ulong)(iVar3 - 1)) {
      iVar3 = 0;
LAB_00102a31:
      parser::BracketNotationParser<label::JSONLabel>::~BracketNotationParser(&bnp);
      std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
      ~vector(&trees_collection);
      node::TreeIndexJSON::~TreeIndexJSON(&ti2);
      node::TreeIndexJSON::~TreeIndexJSON(&ti1);
      std::ifstream::~ifstream(&results_file);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
      ~WangTreeIndex(&wang_algorithm);
      label::LabelDictionary<label::JSONLabel>::~LabelDictionary(&ld);
      std::__cxx11::string::~string((string *)&results_file_name);
      std::__cxx11::string::~string((string *)&input_file_name);
      return iVar3;
    }
    node::
    index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
              (&ti1,trees_collection.
                    super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (iVar3 - 1),&ld,&ucm);
    node::
    index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
              (&ti2,trees_collection.
                    super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (iVar3 - 2U),&ld,&ucm);
    dVar4 = json::
            WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
            jedi(&wang_algorithm,&ti1,&ti2);
    dVar5 = ((double)CONCAT44(0x45300000,
                              (int)(results.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar3 - 2U] >> 0x20))
            - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,
                              (int)results.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar3 - 2U]) -
            4503599627370496.0);
    if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
      poVar2 = std::operator<<((ostream *)&std::cout," ERROR Incorrect JediOrder for trees ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," and ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,": ");
      poVar2 = std::ostream::_M_insert<double>(dVar4);
      poVar2 = std::operator<<(poVar2," instead of ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = -1;
      goto LAB_00102a31;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main(int, char** argv) {

  // Input file name.
  std::string input_file_name = std::string(argv[1]);
  // Input results file name.
  std::string results_file_name = std::string(argv[2]);

  // Type aliases.
  using Label = label::JSONLabel;
  using CostModel = cost_model::UnitCostModelJSON<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  using TreeIndexer = node::TreeIndexJSON;
  using WANG = json::WangTreeIndex<CostModel, TreeIndexer>;
  
  // Initialize label dictionary - separate dictionary for each test tree
  // because it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialize cost model.
  CostModel ucm(ld);
  WANG wang_algorithm(ucm);
  
  // Read results from file.
  std::vector<size_t> results;
  std::ifstream results_file(results_file_name);
  std::size_t single_value = 0;
  for (std::string line; std::getline(results_file, line);) {
    sscanf(line.c_str(), "%zu", &single_value);
    results.push_back(single_value);
  }

  // Initialize two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  TreeIndexer ti1;
  TreeIndexer ti2;

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;
  
  // Parse the dataset.
  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, input_file_name);

  // iterate over all trees in the given collection
  for (unsigned int i = 1; i < trees_collection.size(); i++) {
    // Index input trees.
    node::index_tree(ti1, trees_collection[i], ld, ucm);
    node::index_tree(ti2, trees_collection[i-1], ld, ucm);

    // Compute the label intersection for two consecutive trees.
    double jediorder = wang_algorithm.jedi(ti1, ti2);

    // Verify the result against the given solution.
    if (jediorder != results[i - 1]) {
      std::cout << " ERROR Incorrect JediOrder for trees " << i << " and " 
          << i+1 << ": " << jediorder << " instead of " << results[i - 1] 
          << std::endl;
      return -1;
    }
  }
  
  return 0;
}